

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void ghc::filesystem::current_path(path *p,error_code *ec)

{
  int iVar1;
  error_code eVar2;
  char *local_38 [4];
  
  std::error_code::clear(ec);
  std::__cxx11::string::string((string *)local_38,(string *)p);
  iVar1 = chdir(local_38[0]);
  std::__cxx11::string::~string((string *)local_38);
  if (iVar1 == -1) {
    eVar2 = detail::make_system_error(0);
    ec->_M_value = eVar2._M_value;
    ec->_M_cat = eVar2._M_cat;
  }
  return;
}

Assistant:

GHC_INLINE void current_path(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (!::SetCurrentDirectoryW(detail::fromUtf8<std::wstring>(p.u8string()).c_str())) {
        ec = detail::make_system_error();
    }
#else
    if (::chdir(p.string().c_str()) == -1) {
        ec = detail::make_system_error();
    }
#endif
}